

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O0

int sbisect(int np,poly *sseq,double min,double max,int atmin,int atmax,double *roots)

{
  double dVar1;
  int iVar2;
  uint local_50;
  int nroot;
  int n2;
  int n1;
  int its;
  int atmid;
  double mid;
  double *roots_local;
  int atmax_local;
  int atmin_local;
  double max_local;
  double min_local;
  poly *sseq_local;
  int np_local;
  
  nroot = 0;
  local_50 = 0;
  _atmax_local = max;
  max_local = min;
  if (atmin - atmax == 1) {
    iVar2 = modrf(sseq->ord,sseq->coef,min,max,roots);
    if (iVar2 == 0) {
      for (n2 = 0; n2 < 800; n2 = n2 + 1) {
        _its = (max_local + _atmax_local) / 2.0;
        iVar2 = numchanges(np,sseq,_its);
        if (ABS(_its) <= 1e-12) {
          if (ABS(_atmax_local - max_local) < 1e-12) {
            *roots = _its;
            return 1;
          }
        }
        else if (ABS((_atmax_local - max_local) / _its) < 1e-12) {
          *roots = _its;
          return 1;
        }
        dVar1 = _its;
        if (atmin == iVar2) {
          dVar1 = _atmax_local;
          max_local = _its;
        }
        _atmax_local = dVar1;
      }
      if (n2 == 800) {
        fprintf(_stderr,
                "sbisect: overflow min %f max %f\t\t\t\t\t\t\t                         diff %e nroot %d n1 %d n2 %d\n"
                ,max_local,_atmax_local,_atmax_local - max_local,1,0,0);
        *roots = _its;
      }
    }
  }
  else {
    for (n2 = 0; n2 < 800; n2 = n2 + 1) {
      _its = (max_local + _atmax_local) / 2.0;
      iVar2 = numchanges(np,sseq,_its);
      nroot = atmin - iVar2;
      local_50 = iVar2 - atmax;
      if ((nroot != 0) && (local_50 != 0)) {
        sbisect(np,sseq,max_local,_its,atmin,iVar2,roots);
        sbisect(np,sseq,_its,_atmax_local,iVar2,atmax,roots + nroot);
        break;
      }
      dVar1 = _its;
      if (nroot == 0) {
        dVar1 = _atmax_local;
        max_local = _its;
      }
      _atmax_local = dVar1;
    }
    if (n2 == 800) {
      fprintf(_stderr,"sbisect: roots too close together\n");
      fprintf(_stderr,
              "sbisect: overflow min %f max %f diff %e\t\t\t\t\t\t                      nroot %d n1 %d n2 %d\n"
              ,max_local,_atmax_local,_atmax_local - max_local,(ulong)(uint)(atmin - atmax),
              (ulong)(uint)nroot,(ulong)local_50);
      for (nroot = atmax; nroot < atmin; nroot = nroot + 1) {
        roots[nroot - atmax] = _its;
      }
    }
  }
  return 1;
}

Assistant:

int sbisect(int np, poly *sseq,
	double min, double max,
	int atmin, int atmax,
	double *roots)
{
	double mid;
	int atmid;
	int its;
	int  n1 = 0, n2 = 0;
	int nroot = atmin - atmax;

	if (nroot == 1) {

		/* first try a less expensive technique.  */
		if (modrf(sseq->ord, sseq->coef, min, max, &roots[0]))
			return 1;

		/*
		* if we get here we have to evaluate the root the hard
		* way by using the Sturm sequence.
		*/
		for (its = 0; its < MAXIT; its++) {
			mid = (double)((min + max) / 2);
			atmid = numchanges(np, sseq, mid);

			if (fabs(mid) > RELERROR) {
				if (fabs((max - min) / mid) < RELERROR) {
					roots[0] = mid;
					return 1;
				}
			}
			else if (fabs(max - min) < RELERROR) {
				roots[0] = mid;
				return 1;
			}

			if ((atmin - atmid) == 0)
				min = mid;
			else
				max = mid;
		}

		if (its == MAXIT) {
			fprintf(stderr, "sbisect: overflow min %f max %f\
							                         diff %e nroot %d n1 %d n2 %d\n",
													 min, max, max - min, nroot, n1, n2);
			roots[0] = mid;
		}

		return 1;
	}

	/* more than one root in the interval, we have to bisect */
	for (its = 0; its < MAXIT; its++) {

		mid = (double)((min + max) / 2);
		atmid = numchanges(np, sseq, mid);

		n1 = atmin - atmid;
		n2 = atmid - atmax;

		if (n1 != 0 && n2 != 0) {
			sbisect(np, sseq, min, mid, atmin, atmid, roots);
			sbisect(np, sseq, mid, max, atmid, atmax, &roots[n1]);
			break;
		}

		if (n1 == 0)
			min = mid;
		else
			max = mid;
	}

	if (its == MAXIT) {
		fprintf(stderr, "sbisect: roots too close together\n");
		fprintf(stderr, "sbisect: overflow min %f max %f diff %e\
						                      nroot %d n1 %d n2 %d\n",
											  min, max, max - min, nroot, n1, n2);
		for (n1 = atmax; n1 < atmin; n1++)
			roots[n1 - atmax] = mid;
	}

	return 1;
}